

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoProvider.cpp
# Opt level: O2

void InfoProvider::initGPUInfo(void)

{
  longlong lVar1;
  int *piVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  Worker *this;
  long lVar7;
  int local_9c;
  QString availableOptions;
  QArrayDataPointer<char> local_78;
  QString queryHelp;
  QArrayDataPointer<char16_t> local_48;
  
  QString::QString(&availableOptions,"nvidia-smi --help-query-gpu");
  Utils::exec(&queryHelp,&availableOptions);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&availableOptions.d);
  availableOptions.d.size = 0;
  availableOptions.d.d = (Data *)0x0;
  availableOptions.d.ptr = (char16_t *)0x0;
  local_9c = 0;
  for (lVar7 = 0x10; lVar7 != 0x130; lVar7 = lVar7 + 0x18) {
    lVar1 = *(longlong *)((long)&PTR_typeinfo_00129318 + lVar7);
    piVar2 = *(int **)((long)&DAT_00129320 + lVar7);
    bVar6 = QString::contains(&queryHelp,*(QStringView *)((long)&PTR_typeinfo_name_00129310 + lVar7)
                              ,CaseSensitive);
    if (bVar6) {
      *piVar2 = local_9c;
      QString::append((QChar *)&availableOptions.d,lVar1);
      QString::append((QChar)(char16_t)&availableOptions.d);
      local_9c = local_9c + 1;
    }
  }
  QString::toLocal8Bit((QByteArray *)&local_78,&availableOptions);
  if (local_78.ptr == (char *)0x0) {
    local_78.ptr = (char *)&QByteArray::_empty;
  }
  QString::asprintf((char *)&local_48,"nvidia-smi --query-gpu=%s --format=csv,noheader,nounits",
                    local_78.ptr);
  qVar5 = m_infoQueryCmd.d.size;
  pcVar4 = m_infoQueryCmd.d.ptr;
  pDVar3 = m_infoQueryCmd.d.d;
  m_infoQueryCmd.d.d = local_48.d;
  m_infoQueryCmd.d.ptr = local_48.ptr;
  local_48.d = pDVar3;
  local_48.ptr = pcVar4;
  m_infoQueryCmd.d.size = local_48.size;
  local_48.size = qVar5;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  updateData();
  this = (Worker *)operator_new(0x18);
  *(undefined8 *)&this->super_Worker = 0;
  *(undefined8 *)&(this->super_Worker).field_0x8 = 0;
  (this->super_Worker).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  Worker::Worker(this);
  m_worker = this;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&availableOptions.d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&queryHelp.d);
  return;
}

Assistant:

void InfoProvider::initGPUInfo() {
    const auto queryHelp = exec_cmd("nvidia-smi --help-query-gpu");

    struct Option {
        QStringView name;
        int &index;
    };

    constexpr std::array options{
        Option{u"temperature.gpu"_qsv, m_iGpuTemp},
        Option{u"temperature.memory"_qsv, m_iMemTemp},
        Option{u"clocks.gr"_qsv, m_iGpuFreq},
        Option{u"clocks.max.gr"_qsv, m_iGpuFreqMax},
        Option{u"clocks.mem"_qsv, m_iMemFreq},
        Option{u"clocks.max.mem"_qsv, m_iMemFreqMax},
        Option{u"power.draw"_qsv, m_iPower},
        Option{u"utilization.gpu"_qsv, m_iGpuUtil},
        Option{u"utilization.memory"_qsv, m_iMemUtil},
        Option{u"memory.total"_qsv, m_iMemTotal},
        Option{u"memory.free"_qsv, m_iMemFree},
        Option{u"memory.used"_qsv, m_iMemUsed}
    };

    int index{0};
    QString availableOptions;

    for (const auto [optName, optIndex] : options) {
        if (queryHelp.contains(optName)) {
            optIndex = index;
            availableOptions.append(optName);
            availableOptions.append(',');
            ++index;
        }
    }

    m_infoQueryCmd = QString::asprintf(
        "nvidia-smi --query-gpu=%s --format=csv,noheader,nounits", qPrintable(availableOptions));

    updateData();
    m_worker = new Worker();
}